

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

Abc_Obj_t *
Abc_NtkSpecialMuxTree_rec(Abc_Ntk_t *pNew,Abc_Obj_t **pCtrl,int nCtrl,Abc_Obj_t **pData,int Shift)

{
  int nCtrl_00;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pNode1;
  
  if (nCtrl != 0) {
    nCtrl_00 = nCtrl + -1;
    pAVar1 = Abc_NtkSpecialMuxTree_rec(pNew,pCtrl,nCtrl_00,pData,Shift);
    pNode1 = Abc_NtkSpecialMuxTree_rec
                       (pNew,pCtrl,nCtrl_00,pData,(1 << ((byte)nCtrl_00 & 0x1f)) + Shift);
    pAVar1 = Abc_NtkCreateNodeMux(pNew,pCtrl[(long)nCtrl + -1],pNode1,pAVar1);
    return pAVar1;
  }
  return pData[Shift];
}

Assistant:

Abc_Obj_t * Abc_NtkSpecialMuxTree_rec( Abc_Ntk_t * pNew, Abc_Obj_t ** pCtrl, int nCtrl, Abc_Obj_t ** pData, int Shift )
{
    Abc_Obj_t * pLit0, * pLit1;
    if ( nCtrl == 0 )
        return pData[Shift];
    pLit0 = Abc_NtkSpecialMuxTree_rec( pNew, pCtrl, nCtrl-1, pData, Shift );
    pLit1 = Abc_NtkSpecialMuxTree_rec( pNew, pCtrl, nCtrl-1, pData, Shift + (1<<(nCtrl-1)) );
    return Abc_NtkCreateNodeMux( pNew, pCtrl[nCtrl-1], pLit1, pLit0 );
}